

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper.cpp
# Opt level: O1

Result wallet::feebumper::CreateRateBumpTransaction
                 (CWallet *wallet,uint256 *txid,CCoinControl *coin_control,
                 vector<bilingual_str,_std::allocator<bilingual_str>_> *errors,CAmount *old_fee,
                 CAmount *new_fee,CMutableTransaction *mtx,bool require_mine,
                 vector<CTxOut,_std::allocator<CTxOut>_> *outputs,
                 optional<unsigned_int> original_change_index)

{
  uchar *witness;
  uint uVar1;
  key_type *pkVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_type new_capacity;
  string original;
  string original_00;
  string original_01;
  bilingual_str lhs;
  bilingual_str lhs_00;
  ParamsStream<SizeComputer_&,_TransactionSerParams> *pPVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  isminetype iVar9;
  Result RVar10;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> _Var11;
  CTxOut *pCVar12;
  PreselectedInput *this;
  mapped_type *pmVar13;
  long lVar14;
  T *pTVar15;
  ulong uVar16;
  ulong uVar17;
  CTxIn *txin;
  ulong uVar18;
  long lVar19;
  vector<CTxOut,_std::allocator<CTxOut>_> *__x;
  key_type *pkVar20;
  pointer pCVar21;
  ParamsStream<SizeComputer_&,_TransactionSerParams> *this_00;
  CTxIn *inputs;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> _Var22;
  CAmount CVar23;
  long *plVar24;
  long in_FS_OFFSET;
  bool bVar25;
  TxSize TVar26;
  vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> recipients;
  vector<CTxOut,_std::allocator<CTxOut>_> spent_outputs;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  SignatureWeights weights;
  Result<wallet::CreatedTransactionResult> res;
  SignatureWeightChecker size_checker;
  PrecomputedTransactionData txdata;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  coins;
  undefined8 in_stack_fffffffffffff8e8;
  __node_type *p_Var27;
  __node_type *p_Var28;
  CWallet *pCVar29;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *args;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *pvVar30;
  long lVar31;
  CWalletTx *wtx;
  CAmount *pCVar32;
  vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> local_698;
  vector<CTxOut,_std::allocator<CTxOut>_> local_678;
  unique_lock<std::recursive_mutex> local_658;
  bilingual_str local_648;
  long *local_608 [2];
  long local_5f8 [2];
  bilingual_str local_5e8;
  long *local_5a8 [2];
  long local_598 [2];
  bilingual_str local_588;
  bilingual_str local_548;
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined4 local_4e8;
  undefined4 uStack_4e4;
  undefined8 local_4b8;
  undefined1 local_4b0;
  __index_type local_468;
  long *local_458 [2];
  long local_448 [2];
  undefined1 local_438 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> avStack_420 [2];
  __index_type local_3f0;
  undefined1 local_3e0 [32];
  _Alloc_hider local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0 [13];
  undefined1 local_2d8 [32];
  string local_2b8;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  local_298;
  long *local_268;
  long local_260;
  long local_258 [2];
  long *local_248;
  long local_240;
  long local_238 [2];
  undefined1 local_228 [32];
  string local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  __index_type local_1e0;
  _Optional_payload_base<OutputType> local_1d8;
  bool bStack_1cf;
  undefined8 uStack_1d0;
  _Storage<CFeeRate,_true> local_1c8;
  bool bStack_1c0;
  undefined7 uStack_1bf;
  _Optional_payload_base<unsigned_int> local_1b8;
  undefined8 uStack_1b0;
  int local_1a8;
  int iStack_1a4;
  FlatSigningProvider local_1a0;
  _Optional_payload_base<unsigned_int> local_a8;
  _Optional_payload_base<unsigned_int> _Stack_a0;
  _Optional_payload_base<int> local_98;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  local_90;
  uint local_60;
  long *local_58;
  long local_50;
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar16 = (ulong)original_change_index.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> >> 0x20;
  if (((outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
       super__Vector_impl_data._M_start !=
       (outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
       super__Vector_impl_data._M_finish) && ((uVar16 & 1) != 0)) {
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,
               "The options \'outputs\' and \'original_change_index\' are incompatible. You can only either specify a new set of outputs, or designate a change output to be recycled."
               ,"");
    local_228._0_8_ = local_228 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_228,local_58,local_50 + (long)local_58);
    local_208._0_8_ = &local_1f8;
    std::__cxx11::string::_M_construct<char*>(local_208,local_58,local_50 + (long)local_58);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
              (errors,(bilingual_str *)local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._0_8_ != &local_1f8) {
      operator_delete((void *)local_208._0_8_,local_1f8._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
      operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
    RVar10 = INVALID_PARAMETER;
    goto LAB_00571e45;
  }
  pCVar32 = old_fee;
  _GLOBAL__N_1::std::__detail::__variant::
  _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)local_228,
                    (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)coin_control);
  local_1a8 = coin_control->m_min_depth;
  iStack_1a4 = coin_control->m_max_depth;
  local_1d8 = (coin_control->m_change_type).super__Optional_base<OutputType,_true,_true>._M_payload.
              super__Optional_payload_base<OutputType>;
  uStack_1d0._0_1_ = coin_control->m_include_unsafe_inputs;
  bStack_1cf = coin_control->m_allow_other_inputs;
  uStack_1d0._2_1_ = coin_control->fAllowWatchOnly;
  uStack_1d0._3_1_ = coin_control->fOverrideFeeRate;
  uStack_1d0._4_4_ = *(undefined4 *)&coin_control->field_0x5c;
  local_1c8 = (coin_control->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
              super__Optional_payload_base<CFeeRate>._M_payload;
  bStack_1c0 = (coin_control->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
               super__Optional_payload_base<CFeeRate>._M_engaged;
  uStack_1bf = *(undefined7 *)
                &(coin_control->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
                 super__Optional_payload_base<CFeeRate>.field_0x9;
  local_1b8 = (coin_control->m_confirm_target).super__Optional_base<unsigned_int,_true,_true>.
              _M_payload.super__Optional_payload_base<unsigned_int>;
  uStack_1b0._0_2_ = (coin_control->m_signal_bip125_rbf).super__Optional_base<bool,_true,_true>;
  uStack_1b0._2_1_ = coin_control->m_avoid_partial_spends;
  uStack_1b0._3_1_ = coin_control->m_avoid_address_reuse;
  uStack_1b0._4_4_ = coin_control->m_fee_mode;
  FlatSigningProvider::FlatSigningProvider(&local_1a0,&coin_control->m_external_provider);
  local_98 = (coin_control->m_max_tx_weight).super__Optional_base<int,_true,_true>._M_payload.
             super__Optional_payload_base<int>;
  local_a8 = (coin_control->m_locktime).super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>;
  _Stack_a0 = (coin_control->m_version).super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>;
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  ::_Rb_tree(&local_90,&(coin_control->m_selected)._M_t);
  local_60 = coin_control->m_selection_pos;
  local_658._M_device = &(wallet->cs_wallet).super_recursive_mutex;
  local_658._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_658);
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::_M_erase_at_end
            (errors,(errors->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>).
                    _M_impl.super__Vector_impl_data._M_start);
  _Var11._M_cur =
       (__node_type *)
       _GLOBAL__N_1::std::
       _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       ::find((_Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&wallet->mapWallet,txid);
  if (_Var11._M_cur == (__node_type *)0x0) {
    local_248 = local_238;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,"Invalid or non-wallet transaction id","");
    local_3e0._0_8_ = local_3e0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3e0,local_248,local_240 + (long)local_248);
    local_3c0._M_p = (pointer)local_3b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3c0,local_248,local_240 + (long)local_248);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
              (errors,(bilingual_str *)local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_p != local_3b0) {
      operator_delete(local_3c0._M_p,local_3b0[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_3e0._0_8_ != local_3e0 + 0x10) {
      operator_delete((void *)local_3e0._0_8_,local_3e0._16_8_ + 1);
    }
    if (local_248 != local_238) {
      operator_delete(local_248,local_238[0] + 1);
    }
    RVar10 = INVALID_ADDRESS_OR_KEY;
  }
  else if (((uVar16 & 1) == 0) ||
          (uVar17 = (*(long *)(*(long *)((long)_Var11._M_cur + 0x1c0) + 0x20) -
                     *(long *)(*(long *)((long)_Var11._M_cur + 0x1c0) + 0x18) >> 3) *
                    -0x3333333333333333,
          ((ulong)original_change_index.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> & 0xffffffff) <= uVar17 &&
          uVar17 - ((ulong)original_change_index.super__Optional_base<unsigned_int,_true,_true>.
                           _M_payload.super__Optional_payload_base<unsigned_int> & 0xffffffff) != 0)
          ) {
    local_298._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_298._M_impl.super__Rb_tree_header._M_header;
    local_298._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_298._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_298._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_678.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_678.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_678.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    pkVar20 = (key_type *)**(long **)((long)_Var11._M_cur + 0x1c0);
    pkVar2 = (key_type *)(*(long **)((long)_Var11._M_cur + 0x1c0))[1];
    _Var22._M_cur = _Var11._M_cur;
    local_298._M_impl.super__Rb_tree_header._M_header._M_right =
         local_298._M_impl.super__Rb_tree_header._M_header._M_left;
    if (pkVar20 != pkVar2) {
      do {
        std::
        map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
        ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                      *)&local_298,pkVar20);
        pkVar20 = (key_type *)&pkVar20[2].n;
      } while (pkVar20 != pkVar2);
    }
    if (wallet->m_chain == (Chain *)0x0) {
      __assert_fail("m_chain",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                    ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
    }
    (*wallet->m_chain->_vptr_Chain[0xf])();
    plVar24 = *(long **)((long)&((_Var22._M_cur)->
                                super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                ._M_storage._M_storage + 0x1b8);
    pkVar20 = (key_type *)*plVar24;
    pkVar2 = (key_type *)plVar24[1];
    bVar25 = pkVar20 == pkVar2;
    if (bVar25) {
      lVar31 = 0;
    }
    else {
      lVar31 = 0;
      do {
        pCVar12 = &std::
                   map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                   ::at((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                         *)&local_298,pkVar20)->out;
        lVar19 = pCVar12->nValue;
        if (lVar19 == -1) {
          base_blob<256u>::GetHex_abi_cxx11_((string *)local_508,pkVar20);
          tinyformat::format<std::__cxx11::string,unsigned_int>
                    (&local_2b8,(tinyformat *)"%s:%u is already spent",(char *)local_508,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &pkVar20->n,(uint *)old_fee);
          local_3e0._0_8_ = local_3e0 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3e0,local_2b8._M_dataplus._M_p,
                     local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
          local_3c0._M_p = (pointer)local_3b0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3c0,local_2b8._M_dataplus._M_p,
                     local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                    (errors,(bilingual_str *)local_3e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_p != local_3b0) {
            operator_delete(local_3c0._M_p,local_3b0[0]._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_3e0._0_8_ != local_3e0 + 0x10) {
            operator_delete((void *)local_3e0._0_8_,local_3e0._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_508._0_8_ != local_508 + 0x10) {
            operator_delete((void *)local_508._0_8_,local_4f8._0_8_ + 1);
          }
        }
        else {
          this = CCoinControl::Select((CCoinControl *)local_228,pkVar20);
          iVar9 = CWallet::IsMine(wallet,pkVar20);
          if (iVar9 == ISMINE_NO) {
            PreselectedInput::SetTxOut(this,pCVar12);
          }
          lVar14 = pCVar12->nValue;
          std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back(&local_678,pCVar12);
          lVar31 = lVar31 + lVar14;
        }
        if (lVar19 == -1) break;
        pkVar20 = (key_type *)&pkVar20[2].n;
        bVar25 = pkVar20 == pkVar2;
      } while (!bVar25);
    }
    RVar10 = MISC_ERROR;
    if (bVar25) {
      p_Var27 = _Var22._M_cur;
      memset((PrecomputedTransactionData *)local_3e0,0,0x102);
      local_2d8._0_8_ = (pointer)0x0;
      local_2d8[8] = 0;
      local_2d8._9_7_ = 0;
      local_2d8[0x10] = 0;
      local_2d8._17_8_ = 0;
      PrecomputedTransactionData::Init<CTransaction>
                ((PrecomputedTransactionData *)local_3e0,
                 *(CTransaction **)
                  ((long)&((_Var22._M_cur)->
                          super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>)
                          .super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                          ._M_storage._M_storage + 0x1b8),&local_678,true);
      plVar24 = *(long **)((long)&((_Var22._M_cur)->
                                  super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                  ._M_storage._M_storage + 0x1b8);
      lVar19 = *plVar24;
      if (plVar24[1] != lVar19) {
        uVar17 = 0;
        uVar18 = 1;
        do {
          pkVar20 = (key_type *)(uVar17 * 0x68 + lVar19);
          pmVar13 = std::
                    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                    ::at((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                          *)&local_298,pkVar20);
          bVar25 = CCoinControl::IsExternalSelected((CCoinControl *)local_228,pkVar20);
          if (bVar25) {
            local_508._0_8_ = &::TX_NO_WITNESS;
            args = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                   (pkVar20[1].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 4);
            local_438._0_8_ = (_func_int **)0x24;
            local_508._8_8_ = (SizeComputer *)local_438;
            SerializeMany<ParamsStream<SizeComputer&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
                      ((ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_508,args);
            *(size_t *)local_508._8_8_ = *(size_t *)local_508._8_8_ + 4;
            uVar7 = local_438._0_8_;
            local_508._0_8_ = &::TX_WITH_WITNESS;
            local_508._8_8_ = local_438;
            local_438._0_8_ = (_func_int **)0x24;
            SerializeMany<ParamsStream<SizeComputer&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
                      ((ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_508,args);
            _Var22._M_cur = p_Var27;
            *(size_t *)local_508._8_8_ = *(size_t *)local_508._8_8_ + 4;
            uVar8 = local_438._0_8_;
            witness = pkVar20[2].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8;
            local_508._0_8_ = (pointer)0x0;
            VectorFormatter<DefaultFormatter>::
            Ser<SizeComputer,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                      ((VectorFormatter<DefaultFormatter> *)local_438,(SizeComputer *)local_508,
                       (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)witness);
            uVar6 = local_508._0_8_;
            local_5e8.original._M_dataplus._M_p._0_4_ = 0;
            local_5e8.original._M_string_length = 0;
            local_508._8_8_ =
                 *(size_type *)
                  ((long)&((_Var22._M_cur)->
                          super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>)
                          .super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                          ._M_storage._M_storage + 0x1b8);
            local_508._0_8_ = &PTR_CheckECDSASignature_00b141d8;
            local_4f8._4_4_ = (int)uVar18 + -1;
            local_4f8._0_4_ = 1;
            local_4f8._8_8_ = (pmVar13->out).nValue;
            _local_4e8 = local_3e0;
            local_438._0_8_ = &PTR_CheckECDSASignature_00b172b0;
            local_438._16_8_ = &local_5e8;
            local_438._8_8_ = (ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_508;
            VerifyScript((CScript *)args,&(pmVar13->out).scriptPubKey,(CScriptWitness *)witness,
                         0x1fffdf,(BaseSignatureChecker *)local_438,(ScriptError *)0x0);
            CCoinControl::SetInputWeight
                      ((CCoinControl *)local_228,pkVar20,
                       (int64_t)((pointer)(uVar8 + uVar6) +
                                (long)(int)local_5e8.original._M_dataplus._M_p * 0x48 +
                                (uVar7 * 3 - local_5e8.original._M_string_length)));
            p_Var27 = _Var22._M_cur;
          }
          plVar24 = *(long **)((long)&((_Var22._M_cur)->
                                      super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                      ).
                                      super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                      ._M_storage._M_storage + 0x1b8);
          lVar19 = *plVar24;
          uVar17 = (plVar24[1] - lVar19 >> 3) * 0x4ec4ec4ec4ec4ec5;
          bVar25 = uVar18 <= uVar17;
          lVar14 = uVar17 - uVar18;
          uVar17 = uVar18;
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (bVar25 && lVar14 != 0);
      }
      wtx = (CWalletTx *)
            ((long)&((_Var11._M_cur)->
                    super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
                    super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>.
                    _M_storage._M_storage + 0x20);
      RVar10 = PreconditionChecks(wallet,wtx,require_mine,errors);
      if (RVar10 == OK) {
        lVar19 = *(long *)((long)&((_Var22._M_cur)->
                                  super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                  ._M_storage._M_storage + 0x1b8);
        lVar14 = 0;
        for (plVar24 = *(long **)(lVar19 + 0x18); plVar24 != *(long **)(lVar19 + 0x20);
            plVar24 = plVar24 + 5) {
          lVar14 = lVar14 + *plVar24;
        }
        *pCVar32 = lVar31 - lVar14;
        local_698.super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_698.super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_698.super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        __x = (vector<CTxOut,_std::allocator<CTxOut>_> *)(lVar19 + 0x18);
        if ((outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
            super__Vector_impl_data._M_start !=
            (outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          __x = outputs;
        }
        pCVar21 = (__x->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((__x->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
            super__Vector_impl_data._M_finish == pCVar21) {
          CVar23 = 0;
        }
        else {
          lVar19 = 0;
          CVar23 = 0;
          uVar17 = 0;
          do {
            local_438._16_8_ = (bilingual_str *)0x0;
            avStack_420[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_438._0_8_ = (ParamsStream<SizeComputer_&,_TransactionSerParams> *)0x0;
            local_438._8_8_ = (ParamsStream<SizeComputer_&,_TransactionSerParams> *)0x0;
            local_3f0 = '\0';
            ExtractDestination((CScript *)
                               ((long)&(pCVar21->scriptPubKey).super_CScriptBase._union + lVar19),
                               (CTxDestination *)local_438);
            pCVar12 = (CTxOut *)((long)&pCVar21->nValue + lVar19);
            if ((uVar16 & 1) == 0) {
              bVar25 = OutputIsChange(wallet,pCVar12);
              if (bVar25) goto LAB_00571870;
LAB_005718ad:
              _GLOBAL__N_1::std::__detail::__variant::
              _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)local_508,
                                (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)local_438);
              local_4b8 = pCVar12->nValue;
              local_4b0 = false;
              std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::push_back
                        (&local_698,(value_type *)local_508);
              std::__detail::__variant::
              _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                   *)local_508);
            }
            else {
              if (((ulong)original_change_index.super__Optional_base<unsigned_int,_true,_true>.
                          _M_payload.super__Optional_payload_base<unsigned_int> & 0xffffffff) !=
                  uVar17) goto LAB_005718ad;
LAB_00571870:
              local_508._0_8_ = local_228;
              (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&>
                ::_S_vtable._M_arr[(long)(char)local_3f0 + 1]._M_data)
                        ((anon_class_8_1_8991fb9c_conflict2 *)local_508,
                         (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                          *)local_438);
            }
            CVar23 = CVar23 + pCVar12->nValue;
            std::__detail::__variant::
            _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)local_438);
            uVar17 = uVar17 + 1;
            pCVar21 = (__x->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            lVar19 = lVar19 + 0x28;
          } while (uVar17 < (ulong)(((long)(__x->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pCVar21 >> 3) * -0x3333333333333333));
        }
        p_Var28 = p_Var27;
        pCVar29 = wallet;
        pvVar30 = errors;
        if (local_698.super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            local_698.super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          if (local_1e0 != '\0') {
            _GLOBAL__N_1::std::__detail::__variant::
            _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)local_508,
                              (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)local_228);
            local_4b0 = true;
            local_4b8 = CVar23;
            std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::
            emplace_back<wallet::CRecipient>(&local_698,(CRecipient *)local_508);
            std::__detail::__variant::
            _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
            ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)local_508);
            local_4f8._0_8_ = 0;
            local_4f8._8_8_ = 0;
            local_508._0_8_ = (undefined **)0x0;
            local_508._8_8_ = (SizeComputer *)0x0;
            std::
            variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
            ::operator=((variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                         *)local_228,(CNoDestination *)local_508);
            if (0x1c < (uint)local_4f8._12_4_) {
              free((void *)local_508._0_8_);
              local_508._0_8_ = (undefined **)0x0;
            }
            goto LAB_0057194e;
          }
          local_458[0] = local_448;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_458,
                     "Unable to create transaction. Transaction must have at least one recipient",""
                    );
          original_01._M_string_length = (size_type)p_Var27;
          original_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8e8;
          original_01.field_2._M_allocated_capacity = (size_type)wallet;
          original_01.field_2._8_8_ = __x;
          Untranslated((bilingual_str *)local_508,original_01);
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                    (errors,(bilingual_str *)local_508);
          bilingual_str::~bilingual_str((bilingual_str *)local_508);
          if (local_458[0] != local_448) {
            operator_delete(local_458[0],local_448[0] + 1);
          }
          RVar10 = INVALID_PARAMETER;
        }
        else {
LAB_0057194e:
          if ((coin_control->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
              super__Optional_payload_base<CFeeRate>._M_engaged == true) {
            CMutableTransaction::CMutableTransaction
                      ((CMutableTransaction *)local_438,
                       *(CTransaction **)
                        ((long)&(p_Var27->
                                super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                ._M_storage._M_storage + 0x1b8));
            uVar6 = local_438._8_8_;
            if (local_438._0_8_ != local_438._8_8_) {
              this_00 = (ParamsStream<SizeComputer_&,_TransactionSerParams> *)
                        (local_438._0_8_ + 0x50);
              do {
                prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                           &this_00[-3].m_substream,0);
                uVar1 = *(uint *)((long)&this_00[-1].m_params + 4);
                new_capacity = uVar1 - 0x1d;
                if (uVar1 < 0x1d) {
                  new_capacity = uVar1;
                }
                prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                           &this_00[-3].m_substream,new_capacity);
                CScriptWitness::SetNull((CScriptWitness *)this_00);
                pPVar5 = this_00 + 1;
                this_00 = (ParamsStream<SizeComputer_&,_TransactionSerParams> *)
                          &this_00[6].m_substream;
              } while (&pPVar5->m_substream != (SizeComputer **)uVar6);
            }
            std::vector<CTxOut,_std::allocator<CTxOut>_>::operator=(avStack_420,__x);
            CTransaction::CTransaction((CTransaction *)local_508,(CMutableTransaction *)local_438);
            TVar26 = CalculateMaximumSignedTxSize
                               ((CTransaction *)local_508,wallet,(CCoinControl *)local_228);
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_4f8 + 8));
            std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_508);
            RVar10 = CheckFeeRate(wallet,(CMutableTransaction *)local_438,&local_1c8._M_value,
                                  TVar26.vsize,*pCVar32,errors);
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_420);
            wallet = pCVar29;
            errors = pvVar30;
            std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_438);
            pCVar29 = wallet;
            pvVar30 = errors;
            if (RVar10 != OK) goto LAB_00571dac;
          }
          else {
            local_1c8._M_value = EstimateFeeRate(wallet,wtx,*pCVar32,(CCoinControl *)local_228);
            if (bStack_1c0 == false) {
              bStack_1c0 = true;
            }
          }
          puVar3 = *(undefined8 **)
                    ((long)&(p_Var27->
                            super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                            ._M_storage._M_storage + 0x1b8);
          plVar24 = (long *)*puVar3;
          plVar4 = (long *)puVar3[1];
          if (plVar24 != plVar4) {
            do {
              local_4e8 = (int)plVar24[4];
              local_508._0_8_ = *plVar24;
              local_508._8_8_ = plVar24[1];
              local_4f8._0_8_ = plVar24[2];
              local_4f8._8_8_ = plVar24[3];
              CCoinControl::Select((CCoinControl *)local_228,(COutPoint *)local_508);
              plVar24 = plVar24 + 0xd;
            } while (plVar24 != plVar4);
          }
          bStack_1cf = true;
          local_1a8 = 1;
          CreateTransaction((Result<wallet::CreatedTransactionResult> *)local_508,wallet,&local_698,
                            (optional<unsigned_int>)0x0,(CCoinControl *)local_228,false);
          if (local_468 == '\x01') {
            pTVar15 = util::Result<wallet::CreatedTransactionResult>::value
                                ((Result<wallet::CreatedTransactionResult> *)local_508);
            *new_fee = pTVar15->fee;
            CMutableTransaction::CMutableTransaction
                      ((CMutableTransaction *)local_438,
                       (pTVar15->tx).
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            CMutableTransaction::operator=(mtx,(CMutableTransaction *)local_438);
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_420);
            std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_438);
            RVar10 = OK;
          }
          else {
            local_5a8[0] = local_598;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5a8,"Unable to create transaction.","");
            original._M_string_length = (size_type)p_Var28;
            original._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8e8;
            original.field_2._M_allocated_capacity = (size_type)pCVar29;
            original.field_2._8_8_ = __x;
            Untranslated(&local_588,original);
            local_608[0] = local_5f8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_608," ","");
            original_00._M_string_length = (size_type)p_Var28;
            original_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8e8;
            original_00.field_2._M_allocated_capacity = (size_type)pCVar29;
            original_00.field_2._8_8_ = __x;
            Untranslated(&local_5e8,original_00);
            lhs.original._M_string_length = (size_type)p_Var28;
            lhs.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8e8;
            lhs.original.field_2._M_allocated_capacity = (size_type)pCVar29;
            lhs.original.field_2._8_8_ = __x;
            lhs.translated._M_dataplus._M_p = (pointer)pvVar30;
            lhs.translated._M_string_length = lVar31;
            lhs.translated.field_2._M_allocated_capacity = (size_type)wtx;
            lhs.translated.field_2._8_8_ = pCVar32;
            operator+(&local_548,lhs,&local_588);
            util::ErrorString<wallet::CreatedTransactionResult>
                      (&local_648,(Result<wallet::CreatedTransactionResult> *)local_508);
            lhs_00.original._M_string_length = (size_type)p_Var28;
            lhs_00.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8e8;
            lhs_00.original.field_2._M_allocated_capacity = (size_type)pCVar29;
            lhs_00.original.field_2._8_8_ = __x;
            lhs_00.translated._M_dataplus._M_p = (pointer)pvVar30;
            lhs_00.translated._M_string_length = lVar31;
            lhs_00.translated.field_2._M_allocated_capacity = (size_type)wtx;
            lhs_00.translated.field_2._8_8_ = pCVar32;
            operator+((bilingual_str *)local_438,lhs_00,&local_548);
            std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                      (errors,(bilingual_str *)local_438);
            bilingual_str::~bilingual_str((bilingual_str *)local_438);
            bilingual_str::~bilingual_str(&local_648);
            bilingual_str::~bilingual_str(&local_548);
            bilingual_str::~bilingual_str(&local_5e8);
            if (local_608[0] != local_5f8) {
              operator_delete(local_608[0],local_5f8[0] + 1);
            }
            bilingual_str::~bilingual_str(&local_588);
            if (local_5a8[0] != local_598) {
              operator_delete(local_5a8[0],local_598[0] + 1);
            }
            RVar10 = WALLET_ERROR;
          }
          _GLOBAL__N_1::std::__detail::__variant::
          _Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>::
          ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>
                             *)local_508);
        }
LAB_00571dac:
        std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::~vector(&local_698);
      }
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_2d8);
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_678);
    std::
    _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
    ::~_Rb_tree(&local_298);
  }
  else {
    local_268 = local_258;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_268,"Change position is out of range","");
    local_3e0._0_8_ = local_3e0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3e0,local_268,local_260 + (long)local_268);
    local_3c0._M_p = (pointer)local_3b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3c0,local_268,local_260 + (long)local_268);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
              (errors,(bilingual_str *)local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_p != local_3b0) {
      operator_delete(local_3c0._M_p,local_3b0[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_3e0._0_8_ != local_3e0 + 0x10) {
      operator_delete((void *)local_3e0._0_8_,local_3e0._16_8_ + 1);
    }
    if (local_268 != local_258) {
      operator_delete(local_268,local_258[0] + 1);
    }
    RVar10 = INVALID_PARAMETER;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_658);
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  ::~_Rb_tree(&local_1a0.tr_trees._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&local_1a0.keys._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  ::~_Rb_tree(&local_1a0.origins._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  ::~_Rb_tree(&local_1a0.pubkeys._M_t);
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&local_1a0.scripts._M_t);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_228);
LAB_00571e45:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return RVar10;
}

Assistant:

Result CreateRateBumpTransaction(CWallet& wallet, const uint256& txid, const CCoinControl& coin_control, std::vector<bilingual_str>& errors,
                                 CAmount& old_fee, CAmount& new_fee, CMutableTransaction& mtx, bool require_mine, const std::vector<CTxOut>& outputs, std::optional<uint32_t> original_change_index)
{
    // For now, cannot specify both new outputs to use and an output index to send change
    if (!outputs.empty() && original_change_index.has_value()) {
        errors.push_back(Untranslated("The options 'outputs' and 'original_change_index' are incompatible. You can only either specify a new set of outputs, or designate a change output to be recycled."));
        return Result::INVALID_PARAMETER;
    }

    // We are going to modify coin control later, copy to reuse
    CCoinControl new_coin_control(coin_control);

    LOCK(wallet.cs_wallet);
    errors.clear();
    auto it = wallet.mapWallet.find(txid);
    if (it == wallet.mapWallet.end()) {
        errors.push_back(Untranslated("Invalid or non-wallet transaction id"));
        return Result::INVALID_ADDRESS_OR_KEY;
    }
    const CWalletTx& wtx = it->second;

    // Make sure that original_change_index is valid
    if (original_change_index.has_value() && original_change_index.value() >= wtx.tx->vout.size()) {
        errors.push_back(Untranslated("Change position is out of range"));
        return Result::INVALID_PARAMETER;
    }

    // Retrieve all of the UTXOs and add them to coin control
    // While we're here, calculate the input amount
    std::map<COutPoint, Coin> coins;
    CAmount input_value = 0;
    std::vector<CTxOut> spent_outputs;
    for (const CTxIn& txin : wtx.tx->vin) {
        coins[txin.prevout]; // Create empty map entry keyed by prevout.
    }
    wallet.chain().findCoins(coins);
    for (const CTxIn& txin : wtx.tx->vin) {
        const Coin& coin = coins.at(txin.prevout);
        if (coin.out.IsNull()) {
            errors.push_back(Untranslated(strprintf("%s:%u is already spent", txin.prevout.hash.GetHex(), txin.prevout.n)));
            return Result::MISC_ERROR;
        }
        PreselectedInput& preset_txin = new_coin_control.Select(txin.prevout);
        if (!wallet.IsMine(txin.prevout)) {
            preset_txin.SetTxOut(coin.out);
        }
        input_value += coin.out.nValue;
        spent_outputs.push_back(coin.out);
    }

    // Figure out if we need to compute the input weight, and do so if necessary
    PrecomputedTransactionData txdata;
    txdata.Init(*wtx.tx, std::move(spent_outputs), /* force=*/ true);
    for (unsigned int i = 0; i < wtx.tx->vin.size(); ++i) {
        const CTxIn& txin = wtx.tx->vin.at(i);
        const Coin& coin = coins.at(txin.prevout);

        if (new_coin_control.IsExternalSelected(txin.prevout)) {
            // For external inputs, we estimate the size using the size of this input
            int64_t input_weight = GetTransactionInputWeight(txin);
            // Because signatures can have different sizes, we need to figure out all of the
            // signature sizes and replace them with the max sized signature.
            // In order to do this, we verify the script with a special SignatureChecker which
            // will observe the signatures verified and record their sizes.
            SignatureWeights weights;
            TransactionSignatureChecker tx_checker(wtx.tx.get(), i, coin.out.nValue, txdata, MissingDataBehavior::FAIL);
            SignatureWeightChecker size_checker(weights, tx_checker);
            VerifyScript(txin.scriptSig, coin.out.scriptPubKey, &txin.scriptWitness, STANDARD_SCRIPT_VERIFY_FLAGS, size_checker);
            // Add the difference between max and current to input_weight so that it represents the largest the input could be
            input_weight += weights.GetWeightDiffToMax();
            new_coin_control.SetInputWeight(txin.prevout, input_weight);
        }
    }

    Result result = PreconditionChecks(wallet, wtx, require_mine, errors);
    if (result != Result::OK) {
        return result;
    }

    // Calculate the old output amount.
    CAmount output_value = 0;
    for (const auto& old_output : wtx.tx->vout) {
        output_value += old_output.nValue;
    }

    old_fee = input_value - output_value;

    // Fill in recipients (and preserve a single change key if there
    // is one). If outputs vector is non-empty, replace original
    // outputs with its contents, otherwise use original outputs.
    std::vector<CRecipient> recipients;
    CAmount new_outputs_value = 0;
    const auto& txouts = outputs.empty() ? wtx.tx->vout : outputs;
    for (size_t i = 0; i < txouts.size(); ++i) {
        const CTxOut& output = txouts.at(i);
        CTxDestination dest;
        ExtractDestination(output.scriptPubKey, dest);
        if (original_change_index.has_value() ?  original_change_index.value() == i : OutputIsChange(wallet, output)) {
            new_coin_control.destChange = dest;
        } else {
            CRecipient recipient = {dest, output.nValue, false};
            recipients.push_back(recipient);
        }
        new_outputs_value += output.nValue;
    }

    // If no recipients, means that we are sending coins to a change address
    if (recipients.empty()) {
        // Just as a sanity check, ensure that the change address exist
        if (std::get_if<CNoDestination>(&new_coin_control.destChange)) {
            errors.emplace_back(Untranslated("Unable to create transaction. Transaction must have at least one recipient"));
            return Result::INVALID_PARAMETER;
        }

        // Add change as recipient with SFFO flag enabled, so fees are deduced from it.
        // If the output differs from the original tx output (because the user customized it) a new change output will be created.
        recipients.emplace_back(CRecipient{new_coin_control.destChange, new_outputs_value, /*fSubtractFeeFromAmount=*/true});
        new_coin_control.destChange = CNoDestination();
    }

    if (coin_control.m_feerate) {
        // The user provided a feeRate argument.
        // We calculate this here to avoid compiler warning on the cs_wallet lock
        // We need to make a temporary transaction with no input witnesses as the dummy signer expects them to be empty for external inputs
        CMutableTransaction temp_mtx{*wtx.tx};
        for (auto& txin : temp_mtx.vin) {
            txin.scriptSig.clear();
            txin.scriptWitness.SetNull();
        }
        temp_mtx.vout = txouts;
        const int64_t maxTxSize{CalculateMaximumSignedTxSize(CTransaction(temp_mtx), &wallet, &new_coin_control).vsize};
        Result res = CheckFeeRate(wallet, temp_mtx, *new_coin_control.m_feerate, maxTxSize, old_fee, errors);
        if (res != Result::OK) {
            return res;
        }
    } else {
        // The user did not provide a feeRate argument
        new_coin_control.m_feerate = EstimateFeeRate(wallet, wtx, old_fee, new_coin_control);
    }

    // Fill in required inputs we are double-spending(all of them)
    // N.B.: bip125 doesn't require all the inputs in the replaced transaction to be
    // used in the replacement transaction, but it's very important for wallets to make
    // sure that happens. If not, it would be possible to bump a transaction A twice to
    // A2 and A3 where A2 and A3 don't conflict (or alternatively bump A to A2 and A2
    // to A3 where A and A3 don't conflict). If both later get confirmed then the sender
    // has accidentally double paid.
    for (const auto& inputs : wtx.tx->vin) {
        new_coin_control.Select(COutPoint(inputs.prevout));
    }
    new_coin_control.m_allow_other_inputs = true;

    // We cannot source new unconfirmed inputs(bip125 rule 2)
    new_coin_control.m_min_depth = 1;

    auto res = CreateTransaction(wallet, recipients, /*change_pos=*/std::nullopt, new_coin_control, false);
    if (!res) {
        errors.push_back(Untranslated("Unable to create transaction.") + Untranslated(" ") + util::ErrorString(res));
        return Result::WALLET_ERROR;
    }

    const auto& txr = *res;
    // Write back new fee if successful
    new_fee = txr.fee;

    // Write back transaction
    mtx = CMutableTransaction(*txr.tx);

    return Result::OK;
}